

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::BitsToFloatCase::BitsToFloatCase
          (BitsToFloatCase *this,Context *context,DataType baseType,ShaderType shaderType)

{
  bool bVar1;
  char *pcVar2;
  char *description;
  ShaderType in_R8D;
  DataType local_180;
  VarType local_148;
  allocator<char> local_129;
  string local_128;
  Symbol local_108;
  VarType local_d0;
  allocator<char> local_b1;
  string local_b0;
  Symbol local_90;
  DataType local_58;
  int local_54;
  DataType floatType;
  int vecSize;
  bool inIsSigned;
  string local_40;
  ShaderType local_20;
  DataType local_1c;
  ShaderType shaderType_local;
  DataType baseType_local;
  Context *context_local;
  BitsToFloatCase *this_local;
  
  local_20 = shaderType;
  local_1c = baseType;
  _shaderType_local = context;
  context_local = (Context *)this;
  getCommonFuncCaseName_abi_cxx11_
            (&local_40,(Functional *)(ulong)baseType,TYPE_FLOAT_VEC2,shaderType,in_R8D);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = glu::isDataTypeIntOrIVec(local_1c);
  description = "uintBitsToFloat";
  if (bVar1) {
    description = "intBitsToFloat";
  }
  CommonFunctionCase::CommonFunctionCase
            (&this->super_CommonFunctionCase,context,pcVar2,description,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BitsToFloatCase_032b2530;
  floatType._3_1_ = glu::isDataTypeIntOrIVec(local_1c);
  local_54 = glu::getDataTypeScalarSize(local_1c);
  if (local_54 < 2) {
    local_180 = TYPE_FLOAT;
  }
  else {
    local_180 = glu::getDataTypeFloatVec(local_54);
  }
  local_58 = local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"in0",&local_b1);
  glu::VarType::VarType(&local_d0,local_1c,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_90,&local_b0,&local_d0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_CommonFunctionCase).m_spec.inputs,&local_90);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_90);
  glu::VarType::~VarType(&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"out0",&local_129);
  glu::VarType::VarType(&local_148,local_58,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_108,&local_128,&local_148);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_CommonFunctionCase).m_spec.outputs,&local_108);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_108);
  glu::VarType::~VarType(&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  pcVar2 = "out0 = uintBitsToFloat(in0);";
  if ((floatType._3_1_ & 1) != TYPE_INVALID >> 0x18) {
    pcVar2 = "out0 = intBitsToFloat(in0);";
  }
  std::__cxx11::string::operator=((string *)&(this->super_CommonFunctionCase).m_spec.source,pcVar2);
  return;
}

Assistant:

BitsToFloatCase (Context& context, glu::DataType baseType, glu::ShaderType shaderType)
		: CommonFunctionCase(context, getCommonFuncCaseName(baseType, glu::PRECISION_HIGHP, shaderType).c_str(), glu::isDataTypeIntOrIVec(baseType) ? "intBitsToFloat" : "uintBitsToFloat", shaderType)
	{
		const bool			inIsSigned	= glu::isDataTypeIntOrIVec(baseType);
		const int			vecSize		= glu::getDataTypeScalarSize(baseType);
		const glu::DataType	floatType	= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;

		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, glu::PRECISION_HIGHP)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(floatType, glu::PRECISION_HIGHP)));
		m_spec.source = inIsSigned ? "out0 = intBitsToFloat(in0);" : "out0 = uintBitsToFloat(in0);";
	}